

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O0

void done_generating_code(void)

{
  int iVar1;
  OpcodeMappingInfo *pOVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char *in_stack_ffffffffffffff48;
  undefined4 uVar14;
  int local_4c;
  int j;
  OpcodeMappingInfo *m;
  ulong uStack_38;
  uint ix;
  long i;
  
  if (preprocess_only == FALSE) {
    fputs("\n#ifdef USE_DIRECT_DISPATCH\n    static const void* dispatch_table[] = {\n",
          (FILE *)syn68k_c_stream);
    for (uStack_38 = 0; (long)uStack_38 < 0x10000; uStack_38 = uStack_38 + 1) {
      if (synthetic_opcode_taken[uStack_38] == 0xff) {
        fprintf((FILE *)syn68k_c_stream,"        &&S68K_HANDLE_0x%04lX,\n",uStack_38);
      }
    }
    fputs("        0\n    };\nreturn_dispatch_table:\n    *out_dispatch_table = dispatch_table;\n}\n"
          ,(FILE *)syn68k_c_stream);
    fputs("#else\n       }\n    }\n}\n#endif /* USE_DIRECT_DISPATCH */\n",(FILE *)syn68k_c_stream);
    if (verbose != FALSE) {
      printf("Outputting opcode map index table...");
      fflush(_stdout);
    }
    fputs("#include \"syn68k_private.h\"\n\nconst uint16 opcode_map_index[65536] = {\n",
          (FILE *)mapindex_c_stream);
    for (uStack_38 = 0; (long)uStack_38 < 0x10000; uStack_38 = uStack_38 + 1) {
      m._4_4_ = (uint)map_index[uStack_38];
      if (m._4_4_ == 0) {
        m._4_4_ = (uint)map_index[0x4afc];
      }
      pcVar4 = "";
      if ((long)uStack_38 % 8 == 0) {
        pcVar4 = "  ";
      }
      fprintf((FILE *)mapindex_c_stream,"%s0x%04X,",pcVar4,(ulong)m._4_4_);
      if ((long)uStack_38 % 8 == 7) {
        fprintf((FILE *)mapindex_c_stream,"  /* 0x%04X */\n",(ulong)((int)uStack_38 - 7));
      }
      else {
        putc(0x20,(FILE *)mapindex_c_stream);
      }
    }
    fputs("};\n",(FILE *)mapindex_c_stream);
    if (verbose != FALSE) {
      puts("done.");
    }
    if (verbose != FALSE) {
      printf("Outputting opcode map information table...");
      fflush(_stdout);
    }
    *(uint *)(opcode_map_info + num_map_infos) =
         *(uint *)(opcode_map_info + num_map_infos) & 0xfffffffe | parity & 1U;
    map_info_opcode_name[num_map_infos] = "Internal use: array terminator";
    num_map_infos = num_map_infos + 1;
    fprintf((FILE *)mapinfo_c_stream,
            "#include \"syn68k_private.h\"\n#ifdef GENERATE_NATIVE_CODE\n#include \"native.h\"\n#include \"native/i386/host-xlate.h\"\n#include \"native/i386/xlate-aux.h\"\n#endif\n\nconst OpcodeMappingInfo opcode_map_info[%d] = {\n"
            ,(ulong)(uint)num_map_infos);
    for (uStack_38 = 0; uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20),
        (long)uStack_38 < (long)num_map_infos; uStack_38 = uStack_38 + 1) {
      lVar3 = uStack_38 * 0x10;
      pOVar2 = opcode_map_info + uStack_38;
      if ((0 < (long)uStack_38) &&
         (iVar1 = strcmp(map_info_opcode_name[uStack_38],map_info_opcode_name[uStack_38 - 1]),
         iVar1 != 0)) {
        putc(10,(FILE *)mapinfo_c_stream);
      }
      uVar6 = *(uint *)pOVar2 >> 0x14 & 1;
      uVar11 = *(uint *)pOVar2 >> 0x15 & 1;
      uVar10 = *(uint *)pOVar2 >> 0x16 & 3;
      uVar13 = *(uint *)pOVar2 >> 0x18 & 3;
      uVar12 = *(uint *)pOVar2 >> 0x1a & 1;
      uVar5 = *(uint *)pOVar2 >> 0x1b & 1;
      uVar9 = *(uint *)pOVar2 >> 0x1c;
      uVar7 = (uint)opcode_map_info[uStack_38].opcode_add_bits;
      in_stack_ffffffffffffff48 =
           (char *)(CONCAT44(uVar14,*(uint *)pOVar2 >> 0x10) & 0xffffffff0000000f);
      uVar8 = (uint)opcode_map_info[uStack_38].opcode_and_bits;
      fprintf((FILE *)mapinfo_c_stream,
              "  /* 0x%04X: %s */\n  { %d, 0x%02X, 0x%02X, 0x%02X, %d, %d, %d, %d, %d, %d, %d, %2d, 0x%04X, 0x%04X,\n"
              ,uStack_38 & 0xffffffff,map_info_opcode_name[uStack_38],(ulong)(*(uint *)pOVar2 & 1),
              (ulong)(*(uint *)pOVar2 >> 1 & 0x1f),*(uint *)pOVar2 >> 6 & 0x1f,
              *(uint *)pOVar2 >> 0xb & 0x1f,in_stack_ffffffffffffff48,uVar6,uVar11,uVar10,uVar13,
              uVar12,uVar5,uVar9,uVar8,uVar7);
      fputs("   { ",(FILE *)mapinfo_c_stream);
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        if ((local_4c != 0) && (local_4c % 2 == 0)) {
          fputs("\n     ",(FILE *)mapinfo_c_stream);
        }
        in_stack_ffffffffffffff48 = ", ";
        if (local_4c == 3) {
          in_stack_ffffffffffffff48 = "";
        }
        fprintf((FILE *)mapinfo_c_stream,"{ %d, %d, %d, %d, %d, %d }%s",
                (ulong)(*(ushort *)(lVar3 + 0x1536d8 + (long)local_4c * 2) & 1),
                (ulong)(*(ushort *)(lVar3 + 0x1536d8 + (long)local_4c * 2) >> 1 & 0x7f),
                (ulong)(*(ushort *)(lVar3 + 0x1536d8 + (long)local_4c * 2) >> 8 & 0x1f),
                (ulong)(*(ushort *)(lVar3 + 0x1536d8 + (long)local_4c * 2) >> 0xd & 1),
                (uint)(*(ushort *)(lVar3 + 0x1536d8 + (long)local_4c * 2) >> 0xe & 1),
                (uint)(*(ushort *)(lVar3 + 0x1536d8 + (long)local_4c * 2) >> 0xf),
                in_stack_ffffffffffffff48,uVar6,uVar11,uVar10,uVar13,uVar12,uVar5,uVar9,uVar8,uVar7)
        ;
      }
      fputs(" } },\n",(FILE *)mapinfo_c_stream);
    }
    fputs("};\n",(FILE *)mapinfo_c_stream);
    if (verbose != FALSE) {
      puts("done.");
    }
  }
  return;
}

Assistant:

void
done_generating_code ()
{
  if (!preprocess_only)
    {
      long i;


			/* Output the end of the interpreter function. */
			
			/* direct-dispatch case:
					 output the dispatch table
					 and code for returning it from the function.
					 */
			fputs("\n"
			      "#ifdef USE_DIRECT_DISPATCH\n"
						"    static const void* dispatch_table[] = {\n",
					  syn68k_c_stream);
		  for (i = 0; i < 65536; i++)
      {
        if (synthetic_opcode_taken[i] == OPCODE_TAKEN)
          {
            fprintf (syn68k_c_stream,
                     "        &&S68K_HANDLE_0x%04lX,\n",
                     (unsigned long) i);
          }
			}
			fputs("        0\n"
						"    };\n"
						"return_dispatch_table:\n"
						"    *out_dispatch_table = dispatch_table;\n"
            "}\n",
            syn68k_c_stream);

      /* Non-direct dispatch version: */
      fputs (
	     "#else\n"
	     "       }\n"
	     "    }\n"
	     "}\n"
			 "#endif /* USE_DIRECT_DISPATCH */\n",
	     syn68k_c_stream);

      /* Output opcode map. */
      if (verbose)
	printf ("Outputting opcode map index table..."), fflush (stdout);

      /* Output preamble for mapindex_c_stream. */
      fputs ("#include \"syn68k_private.h\"\n"
	     "\n"
	     "const uint16 opcode_map_index[65536] = {\n"
	     , mapindex_c_stream);

      /* Print out all of the values w/big endian indices. */
      for (i = 0; i < 65536; i++)
	{
	  unsigned ix = map_index[i];
	  if (ix == 0)      /* Iff no map computed, make it behave */
	    ix = map_index[0x4AFC];  /* like ILLEGAL. */
	  fprintf (mapindex_c_stream, "%s0x%04X,", ((i % 8) == 0) ? "  " : "",
		   ix);
	  if ((i % 8) == 7)
	    fprintf (mapindex_c_stream, "  /* 0x%04X */\n", (unsigned) i - 7);
	  else putc (' ', mapindex_c_stream);
	}

      /* Output postamble for map index. */
      fputs ("};\n", mapindex_c_stream);

      if (verbose)
	puts ("done.");

      /* Output map info. */
      if (verbose)
	printf ("Outputting opcode map information table..."), fflush (stdout);

      /* Add a dummy entry at the end with a different parity so the last
       * map info sequence will be terminated.
       */
      opcode_map_info[num_map_infos].sequence_parity = parity;
      map_info_opcode_name[num_map_infos] = "Internal use: array terminator";
      num_map_infos++;

      /* Output preamble for mapinfo_c_stream. */
      fprintf (mapinfo_c_stream,
	       "#include \"syn68k_private.h\"\n"
	       "#ifdef GENERATE_NATIVE_CODE\n"
	       "#include \"native.h\"\n"
	       "#include \"native/i386/host-xlate.h\"\n"
	       "#include \"native/i386/xlate-aux.h\"\n"
	       "#endif\n"
	       "\n"
	       "const OpcodeMappingInfo opcode_map_info[%d] = {\n",
	       num_map_infos);

      /* Print out all of the structs. */
      for (i = 0; i < num_map_infos; i++)
	{
	  const OpcodeMappingInfo *m = &opcode_map_info[i];
	  int j;

	  /* Put blank line between distinct opcode sequences. */
	  if (i > 0 && strcmp (map_info_opcode_name[i],
			       map_info_opcode_name[i - 1]))
	    putc ('\n', mapinfo_c_stream);

	  /* Output the struct. */
	  fprintf (mapinfo_c_stream,
		   "  /* 0x%04X: %s */\n"
		   "  { %d, 0x%02X, 0x%02X, 0x%02X, %d, %d, %d, %d, %d, "
		   "%d, %d, %2d, 0x%04X, 0x%04X,\n",
		   (unsigned) i, map_info_opcode_name[i],
		   m->sequence_parity,
		   (unsigned) m->cc_may_set,
		   (unsigned) m->cc_may_not_set,
		   (unsigned) m->cc_needed,
		   m->instruction_words, m->ends_block,
		   m->next_block_dynamic,
		   m->amode_size, m->reversed_amode_size, m->amode_expanded,
		   m->reversed_amode_expanded,
		   m->opcode_shift_count, (unsigned) m->opcode_and_bits,
		   (unsigned) m->opcode_add_bits);

	  /* Output the bitfields. */
	  fputs ("   { ", mapinfo_c_stream);
	  for (j = 0; j < MAX_BITFIELDS; j++)
	    {
	      if (j != 0 && (j % 2) == 0)
		fputs ("\n     ", mapinfo_c_stream);
	      fprintf (mapinfo_c_stream, "{ %d, %d, %d, %d, %d, %d }%s",
		       m->bitfield[j].rev_amode, m->bitfield[j].index,
		       m->bitfield[j].length, m->bitfield[j].sign_extend,
		       m->bitfield[j].make_native_endian,
		       m->bitfield[j].words,
		       (j == sizeof m->bitfield / sizeof m->bitfield[0] - 1)
		       ? "" : ", ");
	    }
#ifdef GENERATE_NATIVE_CODE
	  fprintf (mapinfo_c_stream,
		   " },\n"
		   "     %s%s },\n",
		   (m->guest_code_descriptor == NULL) ? "" : "&",
		   ((m->guest_code_descriptor == NULL)
		    ? "NULL" : m->guest_code_descriptor));
#else
	  fputs (" } },\n", mapinfo_c_stream);
#endif
	}
	  
      /* Output postamble for map info. */
      fputs ("};\n", mapinfo_c_stream);
      
      if (verbose)
	puts ("done.");
    }
}